

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::GeneratedMetadataFileName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FileDescriptor *file,
          Options *options)

{
  __type _Var1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  string *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  string result;
  string file_no_suffix;
  string segment;
  string local_50;
  
  pbVar5 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this;
  iVar3 = std::__cxx11::string::find_first_of((char *)pbVar5,0x3d95a6);
  std::__cxx11::string::string((string *)&result,"",(allocator *)&segment);
  std::__cxx11::string::string((string *)&segment,"",(allocator *)&file_no_suffix);
  _Var1 = std::operator==(pbVar5,&kEmptyFile_abi_cxx11_);
  if (_Var1) {
    psVar6 = &kEmptyMetadataFile_abi_cxx11_;
  }
  else {
    if (*file != (FileDescriptor)0x1) {
      file_no_suffix._M_dataplus._M_p = (pointer)&file_no_suffix.field_2;
      file_no_suffix._M_string_length = 0;
      file_no_suffix.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::find_last_of((char *)pbVar5,0x428e32);
      _Var1 = std::operator==(pbVar5,&kEmptyFile_abi_cxx11_);
      if (_Var1) {
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,(string *)&kEmptyMetadataFile_abi_cxx11_);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_d8,(ulong)pbVar5);
        std::__cxx11::string::operator=((string *)&file_no_suffix,(string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        if ((*(byte *)(*(long *)(this + 0x78) + 0x29) & 1) == 0) {
          std::__cxx11::string::append((char *)&result);
          while (iVar3 != -1) {
            std::__cxx11::string::substr((ulong)&local_f8,(ulong)&file_no_suffix);
            anon_unknown_2::UnderscoresToCamelCase(&local_d8,&local_f8,true);
            std::__cxx11::string::operator=((string *)&segment,(string *)&local_d8);
            std::__cxx11::string::~string((string *)&local_d8);
            std::__cxx11::string::~string((string *)&local_f8);
            anon_unknown_2::ReservedNamePrefix(&local_50,&segment,(FileDescriptor *)this);
            std::operator+(&local_f8,&local_50,&segment);
            std::operator+(&local_d8,&local_f8,"/");
            std::__cxx11::string::append((string *)&result);
            std::__cxx11::string::~string((string *)&local_d8);
            std::__cxx11::string::~string((string *)&local_f8);
            std::__cxx11::string::~string((string *)&local_50);
            iVar3 = std::__cxx11::string::find_first_of((char *)&file_no_suffix,0x3d95a6);
          }
        }
        else {
          pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (*(ulong *)(*(long *)(this + 0x78) + 0x88) & 0xfffffffffffffffe);
          if ((pbVar5->_M_string_length != 0) && (bVar2 = std::operator!=(pbVar5,"\\"), bVar2)) {
            std::__cxx11::string::append((string *)&result);
            local_d8._M_dataplus._M_p._0_1_ = 0x5c;
            local_f8._M_dataplus._M_p._0_1_ = 0x2f;
            std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )result._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(result._M_dataplus._M_p + result._M_string_length),(char *)&local_d8,
                       (char *)&local_f8);
            pcVar4 = (char *)std::__cxx11::string::at((ulong)&result);
            if (*pcVar4 != '/') {
              std::__cxx11::string::append((char *)&result);
            }
          }
        }
        std::__cxx11::string::find_last_of((char *)&file_no_suffix,0x3d95a6);
        std::__cxx11::string::substr((ulong)&local_f8,(ulong)&file_no_suffix);
        anon_unknown_2::UnderscoresToCamelCase(&local_d8,&local_f8,true);
        std::__cxx11::string::operator=((string *)&segment,(string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        anon_unknown_2::ReservedNamePrefix(&local_50,&segment,(FileDescriptor *)this);
        std::operator+(&local_f8,&result,&local_50);
        std::operator+(&local_d8,&local_f8,&segment);
        std::operator+(__return_storage_ptr__,&local_d8,".php");
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_50);
      }
      std::__cxx11::string::~string((string *)&file_no_suffix);
      goto LAB_002b64dc;
    }
    psVar6 = &kDescriptorMetadataFile_abi_cxx11_;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar6);
LAB_002b64dc:
  std::__cxx11::string::~string((string *)&segment);
  std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratedMetadataFileName(const FileDescriptor* file,
                                      const Options& options) {
  const std::string& proto_file = file->name();
  int start_index = 0;
  int first_index = proto_file.find_first_of("/", start_index);
  std::string result = "";
  std::string segment = "";

  if (proto_file == kEmptyFile) {
    return kEmptyMetadataFile;
  }
  if (options.is_descriptor) {
    return kDescriptorMetadataFile;
  }

  // Append directory name.
  std::string file_no_suffix;
  int lastindex = proto_file.find_last_of(".");
  if (proto_file == kEmptyFile) {
    return kEmptyMetadataFile;
  } else {
    file_no_suffix = proto_file.substr(0, lastindex);
  }

  if (file->options().has_php_metadata_namespace()) {
    const std::string& php_metadata_namespace =
        file->options().php_metadata_namespace();
    if (!php_metadata_namespace.empty() && php_metadata_namespace != "\\") {
      result += php_metadata_namespace;
      std::replace(result.begin(), result.end(), '\\', '/');
      if (result.at(result.size() - 1) != '/') {
        result += "/";
      }
    }
  } else {
    result += "GPBMetadata/";
    while (first_index != std::string::npos) {
      segment = UnderscoresToCamelCase(
          file_no_suffix.substr(start_index, first_index - start_index), true);
      result += ReservedNamePrefix(segment, file) + segment + "/";
      start_index = first_index + 1;
      first_index = file_no_suffix.find_first_of("/", start_index);
    }
  }

  // Append file name.
  int file_name_start = file_no_suffix.find_last_of("/");
  if (file_name_start == std::string::npos) {
    file_name_start = 0;
  } else {
    file_name_start += 1;
  }
  segment = UnderscoresToCamelCase(
      file_no_suffix.substr(file_name_start, first_index - file_name_start), true);

  return result + ReservedNamePrefix(segment, file) + segment + ".php";
}